

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O3

Matrix * __thiscall Matrix::operator+=(Matrix *this,Matrix *m)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  long lVar5;
  
  bVar4 = bShapeEqual(this,m);
  if ((bVar4) && (iVar1 = this->nData, 0 < (long)iVar1)) {
    pdVar2 = m->pData;
    pdVar3 = this->pData;
    lVar5 = 0;
    do {
      pdVar3[lVar5] = pdVar2[lVar5] + pdVar3[lVar5];
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return this;
}

Assistant:

Matrix &Matrix::operator+=(const Matrix&m)
{
	if( bShapeEqual(m) )
		for( int i=0; i<nData; i++ )
			pData[i] += m.pData[i];
	return *this;
}